

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

void __thiscall
dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::isolate
          (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this)

{
  BBlock<dg::LLVMNode> *this_00;
  
  removeDDs(this);
  removeUses(this);
  removeCDs(this);
  if (this->basicBlock != (BBlock<dg::LLVMNode> *)0x0) {
    BBlock<dg::LLVMNode>::removeNode(this->basicBlock,(LLVMNode *)this);
    this_00 = this->basicBlock;
    if ((this_00->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
        _M_node.super__List_node_base._M_next == (_List_node_base *)&this_00->nodes) {
      BBlock<dg::LLVMNode>::remove(this_00,(char *)0x1);
    }
    if ((this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      BBlock<dg::LLVMNode>::removeCallSite(this->basicBlock,(LLVMNode *)this);
    }
    this->basicBlock = (BBlock<dg::LLVMNode> *)0x0;
  }
  return;
}

Assistant:

void isolate() {
        // remove CD and DD and uses from this node
        removeDDs();
        removeUses();
        removeCDs();

#ifdef ENABLE_CFG
        // if this is head or tail of BB,
        // we must take it into account
        if (basicBlock) {
            // XXX removing the node from BB is in linear time,
            // could we do it better?
            basicBlock->removeNode(static_cast<NodeT *>(this));

            // if this was the only node in BB, remove the BB
            if (basicBlock->empty())
                basicBlock->remove();

            // if this is a callSite it is no longer part of BBlock,
            // so we must remove it from callSites
            if (hasSubgraphs()) {
#ifndef NDEBUG
                bool ret =
#endif
                        basicBlock->removeCallSite(static_cast<NodeT *>(this));
                assert(ret && "the call site was not in BB's callSites");
            }

            basicBlock = nullptr;
        }
#endif
    }